

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O1

int Bdc_ManNodeVerify(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Fun_t *pFunc)

{
  uint *puTruth;
  uint *puVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  
  puTruth = p->puTemp1;
  if (((ulong)pFunc & 1) == 0) {
    uVar7 = 1 << ((char)p->nVars - 5U & 0x1f);
    if (p->nVars < 6) {
      uVar7 = 1;
    }
    if ((int)uVar7 < 1) {
code_r0x0054b9e4:
      uVar3 = (ulong)(uint)(1 << ((char)p->nVars - 5U & 0x1f));
      uVar4 = uVar3;
      if (p->nVars < 6) {
        uVar3 = 1;
        uVar4 = uVar3;
      }
      do {
        iVar2 = (int)uVar3;
        if (iVar2 < 1) goto LAB_0054ba25;
        lVar5 = uVar3 - 1;
        lVar6 = uVar3 - 1;
        uVar3 = uVar3 - 1;
      } while ((pIsf->puOn[lVar6] & ~puTruth[lVar5]) == 0);
      if (iVar2 < 1) {
LAB_0054ba25:
        do {
          if ((int)uVar4 < 1) {
            return 1;
          }
          lVar5 = uVar4 - 1;
          lVar6 = uVar4 - 1;
          uVar4 = uVar4 - 1;
        } while ((puTruth[lVar6] & pIsf->puOff[lVar5]) == 0);
      }
      return 0;
    }
    puVar1 = pFunc->puFunc;
    lVar5 = (ulong)uVar7 + 1;
    do {
      puTruth[lVar5 + -2] = puVar1[lVar5 + -2];
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  else {
    uVar7 = 1 << ((char)p->nVars - 5U & 0x1f);
    if (p->nVars < 6) {
      uVar7 = 1;
    }
    if ((int)uVar7 < 1) goto code_r0x0054b9e4;
    lVar5 = *(long *)(((ulong)pFunc & 0xfffffffffffffffe) + 0x20);
    lVar6 = (ulong)uVar7 + 1;
    do {
      puTruth[lVar6 + -2] = ~*(uint *)(lVar5 + -8 + lVar6 * 4);
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  iVar2 = Bdc_TableCheckContainment(p,pIsf,puTruth);
  return iVar2;
}

Assistant:

int Bdc_ManNodeVerify( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Fun_t * pFunc )
{
    unsigned * puTruth = p->puTemp1;
    if ( Bdc_IsComplement(pFunc) )
        Kit_TruthNot( puTruth, Bdc_Regular(pFunc)->puFunc, p->nVars );
    else
        Kit_TruthCopy( puTruth, pFunc->puFunc, p->nVars );
    return Bdc_TableCheckContainment( p, pIsf, puTruth );
}